

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O0

void __thiscall
ASDCP::MXF::SimpleArray<ASDCP::MXF::RIP::PartitionPair>::Dump
          (SimpleArray<ASDCP::MXF::RIP::PartitionPair> *this,FILE *stream,ui32_t depth)

{
  bool bVar1;
  reference this_00;
  char *pcVar2;
  _Self local_b8;
  _Self local_b0;
  iterator i;
  char identbuf [128];
  FILE *pFStack_18;
  ui32_t depth_local;
  FILE *stream_local;
  SimpleArray<ASDCP::MXF::RIP::PartitionPair> *this_local;
  
  pFStack_18 = (FILE *)stream;
  if (stream == (FILE *)0x0) {
    pFStack_18 = _stderr;
  }
  local_b0._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::begin
                 (&this->
                   super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                 );
  while( true ) {
    local_b8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::end
                   (&this->
                     super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                   );
    bVar1 = std::operator!=(&local_b0,&local_b8);
    if (!bVar1) break;
    this_00 = std::_List_iterator<ASDCP::MXF::RIP::PartitionPair>::operator*(&local_b0);
    pcVar2 = RIP::PartitionPair::EncodeString(this_00,(char *)&i,0x80);
    fprintf(pFStack_18,"  %s\n",pcVar2);
    std::_List_iterator<ASDCP::MXF::RIP::PartitionPair>::operator++(&local_b0,0);
  }
  return;
}

Assistant:

void Dump(FILE* stream = 0, ui32_t depth = 0)
	    {
	      (void) depth;
	      char identbuf[IdentBufferLen];

	      if ( stream == 0 )
		stream = stderr;

	      typename std::list<T>::iterator i = this->begin();
	      for ( ; i != this->end(); i++ )
		fprintf(stream, "  %s\n", (*i).EncodeString(identbuf, IdentBufferLen));
	    }